

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,char *source,char *destination,MatchProperties *match_properties)

{
  cmCommand *this_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  unsigned_long uVar4;
  char *pcVar5;
  mode_t permissions_00;
  unsigned_long dindex;
  Directory dir;
  string toPath;
  mode_t permissions;
  ostringstream e;
  cmFileCopier *local_1e8;
  allocator local_1d9;
  Directory local_1d8;
  string local_1d0;
  mode_t local_1b0;
  uint local_1ac;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8 = this;
  std::__cxx11::string::string((string *)local_1a8,destination,(allocator *)&local_1d0);
  bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_1a8);
  (*local_1e8->_vptr_cmFileCopier[4])(local_1e8,destination,1,(ulong)!bVar1);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar1 = cmsys::SystemTools::MakeDirectory(destination);
  if (bVar1) {
    local_1b0 = match_properties->Permissions;
    if (local_1b0 == 0) {
      local_1b0 = local_1e8->DirPermissions;
    }
    if (local_1b0 == 0) {
      cmsys::SystemTools::GetPermissions(source,&local_1b0);
    }
    permissions_00 = local_1b0 | 0x1c0;
    local_1ac = local_1b0;
    if ((~local_1b0 & 0x1c0) == 0) {
      local_1ac = 0;
      permissions_00 = local_1b0;
    }
    bVar1 = SetPermissions(local_1e8,destination,permissions_00);
    if (bVar1) {
      cmsys::Directory::Directory(&local_1d8);
      if ((source != (char *)0x0) && (*source != '\0')) {
        local_1a8._0_8_ = local_1a8 + 0x10;
        sVar3 = strlen(source);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,source,source + sVar3);
        cmsys::Directory::Load(&local_1d8,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      uVar4 = cmsys::Directory::GetNumberOfFiles(&local_1d8);
      if (uVar4 != 0) {
        dindex = 0;
        do {
          pcVar5 = cmsys::Directory::GetFile(&local_1d8,dindex);
          iVar2 = strcmp(pcVar5,".");
          if (iVar2 != 0) {
            pcVar5 = cmsys::Directory::GetFile(&local_1d8,dindex);
            iVar2 = strcmp(pcVar5,"..");
            if (iVar2 != 0) {
              std::__cxx11::string::string((string *)local_1a8,source,(allocator *)&local_1d0);
              std::__cxx11::string::append((char *)local_1a8);
              cmsys::Directory::GetFile(&local_1d8,dindex);
              std::__cxx11::string::append(local_1a8);
              std::__cxx11::string::string((string *)&local_1d0,destination,&local_1d9);
              std::__cxx11::string::append((char *)&local_1d0);
              cmsys::Directory::GetFile(&local_1d8,dindex);
              std::__cxx11::string::append((char *)&local_1d0);
              iVar2 = (*local_1e8->_vptr_cmFileCopier[2])
                                (local_1e8,local_1a8._0_8_,local_1d0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
              }
              if ((char)iVar2 == '\0') {
                bVar1 = false;
                goto LAB_003b6a8f;
              }
            }
          }
          dindex = dindex + 1;
        } while (uVar4 != dindex);
      }
      bVar1 = SetPermissions(local_1e8,destination,local_1ac);
LAB_003b6a8f:
      cmsys::Directory::~Directory(&local_1d8);
      return bVar1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar5 = local_1e8->Name;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)&local_1e8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x40);
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," cannot make directory \"",0x18);
    if (destination == (char *)0x0) {
      std::ios::clear((int)&local_1e8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x40);
    }
    else {
      sVar3 = strlen(destination);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,destination,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\": ",3);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    this_00 = &local_1e8->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_00,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return false;
}

Assistant:

bool cmFileCopier::InstallDirectory(const char* source,
                                    const char* destination,
                                    MatchProperties const& match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !cmSystemTools::FileIsDirectory(destination));

  // Make sure the destination directory exists.
  if(!cmSystemTools::MakeDirectory(destination))
    {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination << "\": "
      << cmSystemTools::GetLastSystemError();
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Compute the requested permissions for the destination directory.
  mode_t permissions = (match_properties.Permissions?
                        match_properties.Permissions : this->DirPermissions);
  if(!permissions)
    {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
    }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if((permissions & required_permissions) == required_permissions)
    {
    permissions_before = permissions;
    }
  else
    {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
    }

  // Set the required permissions of the destination directory.
  if(!this->SetPermissions(destination, permissions_before))
    {
    return false;
    }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if(source && *source)
    {
    dir.Load(source);
    }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for(unsigned long fileNum = 0; fileNum < numFiles; ++fileNum)
    {
    if(!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
         strcmp(dir.GetFile(fileNum), "..") == 0))
      {
      std::string fromPath = source;
      fromPath += "/";
      fromPath += dir.GetFile(fileNum);
      std::string toPath = destination;
      toPath += "/";
      toPath += dir.GetFile(fileNum);
      if(!this->Install(fromPath.c_str(), toPath.c_str()))
        {
        return false;
        }
      }
    }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}